

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription
          (QRhiTextureRenderTargetDescription *this,QRhiColorAttachment *colorAttachment,
          QRhiTexture *depthTexture)

{
  QVLAStorage<48UL,_8UL,_8LL> *array;
  
  (this->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.a = 8;
  (this->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s = 0;
  array = &(this->m_colorAttachments).super_QVLAStorage<48UL,_8UL,_8LL>;
  (this->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr = array;
  this->m_depthStencilBuffer = (QRhiRenderBuffer *)0x0;
  this->m_depthTexture = depthTexture;
  this->m_depthResolveTexture = (QRhiTexture *)0x0;
  this->m_shadingRateMap = (QRhiShadingRateMap *)0x0;
  QVLABase<QRhiColorAttachment>::emplace_back_impl<QRhiColorAttachment_const&>
            ((QVLABase<QRhiColorAttachment> *)this,8,array,colorAttachment);
  return;
}

Assistant:

QRhiTextureRenderTargetDescription::QRhiTextureRenderTargetDescription(const QRhiColorAttachment &colorAttachment,
                                                                       QRhiTexture *depthTexture)
    : m_depthTexture(depthTexture)
{
    m_colorAttachments.append(colorAttachment);
}